

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mip_level::pack_to_dxt(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  bool bVar1;
  image_u8 *img;
  image_u8 tmp_img;
  image_u8 local_58;
  
  if ((int)fmt < 0x41315844) {
    if ((int)fmt < 0x32495441) {
      if ((int)fmt < 0x31545844) {
        if ((fmt != PIXEL_FMT_ETC1) && (fmt != PIXEL_FMT_DXT5A)) {
          return false;
        }
      }
      else if ((fmt != PIXEL_FMT_DXT1) && (fmt != PIXEL_FMT_ETC2)) {
        return false;
      }
    }
    else if ((int)fmt < 0x33545844) {
      if ((fmt != PIXEL_FMT_3DC) && (fmt != PIXEL_FMT_DXT2)) {
        return false;
      }
    }
    else if (((fmt != PIXEL_FMT_DXT3) && (fmt != PIXEL_FMT_DXT4)) && (fmt != PIXEL_FMT_DXT5)) {
      return false;
    }
  }
  else if ((int)fmt < 0x52784778) {
    if ((int)fmt < 0x52424741) {
      if ((fmt != PIXEL_FMT_DXT1A) && (fmt != PIXEL_FMT_ETC2A)) {
        return false;
      }
    }
    else if ((fmt != PIXEL_FMT_DXT5_AGBR) && (fmt != PIXEL_FMT_DXT5_xGBR)) {
      return false;
    }
  }
  else if ((int)fmt < 0x53413245) {
    if ((fmt != PIXEL_FMT_DXT5_xGxR) && (fmt != PIXEL_FMT_ETC1S)) {
      return false;
    }
  }
  else if (((fmt != PIXEL_FMT_ETC2AS) && (fmt != PIXEL_FMT_DXT5_CCxY)) && (fmt != PIXEL_FMT_DXN)) {
    return false;
  }
  local_58.m_width = 0;
  local_58.m_height = 0;
  local_58.m_pitch = 0;
  local_58.m_total = 0;
  local_58.m_comp_flags = 0xf;
  local_58.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  local_58.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  local_58.m_pixel_buf.m_size = 0;
  local_58.m_pixel_buf.m_capacity = 0;
  img = get_unpacked_image(this,&local_58,1);
  bVar1 = pack_to_dxt(this,img,fmt,cook,p,this->m_orient_flags);
  if (local_58.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(local_58.m_pixel_buf.m_p);
  }
  return bVar1;
}

Assistant:

bool mip_level::pack_to_dxt(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  image_u8 tmp_img;
  image_u8* pImage = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  return pack_to_dxt(*pImage, fmt, cook, p, m_orient_flags);
}